

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void kj::(anonymous_namespace)::expectRes<kj::Array<unsigned_char>,4ul>
               (EncodingResult<kj::Array<unsigned_char>_> *result,byte (*expected) [4],bool errors)

{
  undefined7 in_register_00000011;
  ulong uVar1;
  ulong uVar2;
  CappedArray<char,_3UL> CVar3;
  uchar *puVar4;
  size_t sVar5;
  ArrayDisposer *pAVar6;
  byte bVar7;
  unsigned_long i;
  CappedArray<char,_3UL> local_50;
  CappedArray<char,_3UL> local_40;
  
  puVar4 = (result->super_Array<unsigned_char>).ptr;
  sVar5 = (result->super_Array<unsigned_char>).size_;
  pAVar6 = (result->super_Array<unsigned_char>).disposer;
  (result->super_Array<unsigned_char>).ptr = (uchar *)0x0;
  (result->super_Array<unsigned_char>).size_ = 0;
  bVar7 = result->hadErrors;
  if ((int)CONCAT71(in_register_00000011,errors) == 0) {
    if ((bVar7 & _::Debug::minSeverity < 3) == 1) {
      _::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x2d,ERROR,"\"failed: expected \" \"!result.hadErrors\"",
                 (char (*) [35])"failed: expected !result.hadErrors");
    }
  }
  else if ((bool)bVar7 == false && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x2b,ERROR,"\"failed: expected \" \"result.hadErrors\"",
               (char (*) [34])"failed: expected result.hadErrors");
  }
  if ((sVar5 != 4) && (_::Debug::minSeverity < 3)) {
    local_50.currentSize = 4;
    local_40.currentSize = sVar5;
    _::Debug::log<char_const(&)[50],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x30,ERROR,
               "\"failed: expected \" \"result.size() == expected.size()\", result.size(), expected.size()"
               ,(char (*) [50])"failed: expected result.size() == expected.size()",
               &local_40.currentSize,&local_50.currentSize);
  }
  uVar1 = 4;
  if (sVar5 < 4) {
    uVar1 = sVar5;
  }
  if (sVar5 != 0) {
    uVar2 = 0;
    do {
      i = uVar2;
      if ((puVar4[uVar2] != (*expected)[uVar2]) && (_::Debug::minSeverity < 3)) {
        CVar3 = hex(puVar4[uVar2]);
        local_40.currentSize = CVar3.currentSize;
        local_40.content._0_2_ = CVar3.content._0_2_;
        local_40.content[2] = CVar3.content[2];
        CVar3 = hex((*expected)[i]);
        local_50.currentSize = CVar3.currentSize;
        local_50.content._0_2_ = CVar3.content._0_2_;
        local_50.content[2] = CVar3.content[2];
        _::Debug::
        log<char_const(&)[42],unsigned_long&,kj::CappedArray<char,3ul>,kj::CappedArray<char,3ul>>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                   ,0x32,ERROR,
                   "\"failed: expected \" \"result[i] == expected[i]\", i, hex(result[i]), hex(expected[i])"
                   ,(char (*) [42])"failed: expected result[i] == expected[i]",&i,&local_40,
                   &local_50);
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  if (puVar4 != (uchar *)0x0) {
    (**pAVar6->_vptr_ArrayDisposer)(pAVar6,puVar4,1,sVar5,sVar5,0,0,0,pAVar6,bVar7);
  }
  return;
}

Assistant:

void expectRes(EncodingResult<T> result,
               byte (&expected)[s],
               bool errors = false) {
  expectResImpl(kj::mv(result), arrayPtr<const byte>(expected, s), errors);
}